

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonException.h
# Opt level: O1

void __thiscall Json::JsonException::escape_rs(JsonException *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char c;
  bool bVar2;
  ulong uVar3;
  string v;
  string w;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (s->_M_string_length != 0) {
    uVar3 = 0;
    do {
      c = (s->_M_dataplus)._M_p[uVar3];
      if (c == '\\') {
        std::__cxx11::string::append((char *)&local_70);
      }
      else {
        bVar2 = JsonString::is_escape(c,&local_50);
        if (bVar2) {
          std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::push_back((char)&local_70);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->_M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void escape_rs(std::string &s) const {
            std::string v, w;
            for (size_t i = 0; i < s.size(); ++i)
                if (s[i] == '\\') v += "\\";
                else if (JsonString::is_escape(s[i], w)) v += w;
                else v += s[i];
            s = v;
        }